

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quit.cpp
# Opt level: O1

int pstore::broker::shutdown(int __fd,int __how)

{
  undefined8 *puVar1;
  not_null<const_char_*> nVar2;
  long *plVar3;
  int in_ECX;
  int in_EDX;
  int __how_00;
  int __fd_00;
  undefined4 in_register_00000034;
  char *pcVar4;
  undefined4 in_register_0000003c;
  command_processor *pcVar5;
  maybe<pstore::http::server_status,_void> *in_R8;
  undefined1 *in_R9;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination_1;
  undefined8 *puVar6;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination;
  long *in_FS_OFFSET;
  bool bVar7;
  allocator local_91;
  long *local_90;
  int local_84;
  string local_80;
  not_null<pstore::broker::command_processor_*> local_60;
  not_null<pstore::maybe<pstore::http::server_status,_void>_*> local_58;
  undefined1 *local_50;
  not_null<pstore::broker::command_processor_*> local_48;
  not_null<const_char_*> local_40;
  not_null<const_char_*> local_38;
  
  pcVar5 = (command_processor *)CONCAT44(in_register_0000003c,__fd);
  plVar3 = (long *)0x0;
  LOCK();
  bVar7 = done == 0;
  if (bVar7) {
    done = 1;
  }
  else {
    plVar3 = (long *)(ulong)done;
  }
  UNLOCK();
  if (bVar7) {
    pcVar4 = "pstore broker is exiting.\n";
    local_84 = in_EDX;
    local_58.ptr_ = in_R8;
    local_50 = in_R9;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"pstore broker is exiting.\n",0x1a);
    local_38.ptr_ = "performing shutdown";
    gsl::not_null<const_char_*>::ensure_invariant(&local_38);
    nVar2.ptr_ = local_38.ptr_;
    pstore::details::log_destinations::__tls_init();
    __fd_00 = (int)pcVar4;
    local_90 = (long *)(*in_FS_OFFSET + -8);
    if (*local_90 != 0) {
      pstore::details::log_destinations::__tls_init();
      puVar1 = (undefined8 *)((undefined8 *)*local_90)[1];
      for (puVar6 = *(undefined8 **)*local_90; __fd_00 = (int)pcVar4, puVar6 != puVar1;
          puVar6 = puVar6 + 1) {
        pcVar4 = (char *)0x6;
        (**(code **)(*(long *)*puVar6 + 0x48))((long *)*puVar6,6,nVar2.ptr_);
      }
    }
    gc_sigint(local_84);
    if ((scavenger *)CONCAT44(in_register_00000034,__how) != (scavenger *)0x0) {
      scavenger::shutdown((scavenger *)CONCAT44(in_register_00000034,__how),__fd_00,__how_00);
    }
    if (pcVar5 != (command_processor *)0x0) {
      if (in_ECX != 0) {
        do {
          local_60.ptr_ = pcVar5;
          gsl::not_null<pstore::broker::command_processor_*>::ensure_invariant(&local_60);
          std::__cxx11::string::string((string *)&local_80,"_QUIT",&local_91);
          anon_unknown.dwarf_23272d::push
                    ((not_null<pstore::broker::command_processor_*>)local_60.ptr_,&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          in_ECX = in_ECX + -1;
        } while (in_ECX != 0);
      }
      local_48.ptr_ = pcVar5;
      gsl::not_null<pstore::broker::command_processor_*>::ensure_invariant(&local_48);
      std::__cxx11::string::string((string *)&local_80,"_CQUIT",&local_91);
      anon_unknown.dwarf_23272d::push
                ((not_null<pstore::broker::command_processor_*>)local_48.ptr_,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
    http::quit(local_58);
    LOCK();
    *local_50 = 1;
    UNLOCK();
    local_40.ptr_ = "shutdown requests complete";
    gsl::not_null<const_char_*>::ensure_invariant(&local_40);
    nVar2.ptr_ = local_40.ptr_;
    pstore::details::log_destinations::__tls_init();
    plVar3 = local_90;
    if (*local_90 != 0) {
      pstore::details::log_destinations::__tls_init();
      plVar3 = (long *)*local_90;
      puVar1 = (undefined8 *)plVar3[1];
      for (puVar6 = (undefined8 *)*plVar3; puVar6 != puVar1; puVar6 = puVar6 + 1) {
        plVar3 = (long *)(**(code **)(*(long *)*puVar6 + 0x48))((long *)*puVar6,6,nVar2.ptr_);
      }
    }
  }
  return (int)plVar3;
}

Assistant:

void shutdown (command_processor * const cp, scavenger * const scav, int const signum,
                       unsigned const num_read_threads,
                       not_null<maybe<pstore::http::server_status> *> const http_status,
                       not_null<std::atomic<bool> *> const uptime_done) {

            // Set the global "done" flag unless we're already shutting down. The latter condition
            // happens if a "SUICIDE" command is received and the quit thread is woken in response.
            bool expected = false;
            if (done.compare_exchange_strong (expected, true)) {
                std::cerr << "pstore broker is exiting.\n";
                log (priority::info, "performing shutdown");

                // Tell the gcwatcher thread to exit.
                broker::gc_sigint (signum);

                if (scav != nullptr) {
                    scav->shutdown ();
                }

                if (cp != nullptr) {
                    // Ask the read-loop threads to quit
                    for (auto ctr = 0U; ctr < num_read_threads; ++ctr) {
                        push (cp, read_loop_quit_command);
                    }
                    // Finally ask the command loop thread to exit.
                    push (cp, command_loop_quit_command);
                }

                pstore::http::quit (http_status);
                *uptime_done = true;

                log (priority::info, "shutdown requests complete");
            }
        }